

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerialAnalyzer.cpp
# Opt level: O0

void __thiscall SerialAnalyzer::~SerialAnalyzer(SerialAnalyzer *this)

{
  SerialAnalyzer *this_local;
  
  ~SerialAnalyzer(this);
  operator_delete(this);
  return;
}

Assistant:

SerialAnalyzer::~SerialAnalyzer()
{
    KillThread();
}